

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O1

bool __thiscall
glcts::TestCaseBase::doesProgramBuild
          (TestCaseBase *this,uint n_fs_body_parts,char **fs_body_parts,uint n_gs_body_parts,
          char **gs_body_parts,uint n_vs_body_parts,char **vs_body_parts)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  GLuint po_id;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_0000008c;
  long lVar6;
  
  iVar2 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  uVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  uVar4 = (**(code **)(lVar6 + 0x3f0))((this->m_glExtTokens).GEOMETRY_SHADER);
  uVar5 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  po_id = (**(code **)(lVar6 + 0x3c8))();
  err = (**(code **)(lVar6 + 0x800))();
  glu::checkError(err,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                  ,0x30e);
  bVar1 = buildProgramVA(this,po_id,(bool *)0x0,3,(ulong)uVar5,(ulong)n_fs_body_parts,fs_body_parts,
                         (ulong)uVar4,CONCAT44(in_register_0000000c,n_gs_body_parts),gs_body_parts,
                         (ulong)uVar3,CONCAT44(in_register_0000008c,n_vs_body_parts),vs_body_parts);
  if (po_id != 0) {
    (**(code **)(lVar6 + 0x448))(po_id);
  }
  if (uVar5 != 0) {
    (**(code **)(lVar6 + 0x470))(uVar5);
  }
  if (uVar4 != 0) {
    (**(code **)(lVar6 + 0x470))((ulong)uVar4);
  }
  if (uVar3 != 0) {
    (**(code **)(lVar6 + 0x470))((ulong)uVar3);
  }
  return bVar1;
}

Assistant:

bool TestCaseBase::doesProgramBuild(unsigned int n_fs_body_parts, const char* const* fs_body_parts,
									unsigned int n_gs_body_parts, const char* const* gs_body_parts,
									unsigned int n_vs_body_parts, const char* const* vs_body_parts)
{
	/* General variables */
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = false;

	/* Shaders */
	glw::GLuint vertex_shader_id   = 0;
	glw::GLuint geometry_shader_id = 0;
	glw::GLuint fragment_shader_id = 0;

	/* Program */
	glw::GLuint program_object_id = 0;

	/* Create shaders */
	vertex_shader_id   = gl.createShader(GL_VERTEX_SHADER);
	geometry_shader_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	fragment_shader_id = gl.createShader(GL_FRAGMENT_SHADER);

	/* Create program */
	program_object_id = gl.createProgram();

	/* Check createProgram call for errors */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Compile and link the program */
	result = buildProgram(program_object_id, fragment_shader_id, n_fs_body_parts, fs_body_parts, geometry_shader_id,
						  n_gs_body_parts, gs_body_parts, vertex_shader_id, n_vs_body_parts, vs_body_parts);

	if (program_object_id != 0)
		gl.deleteProgram(program_object_id);
	if (fragment_shader_id != 0)
		gl.deleteShader(fragment_shader_id);
	if (geometry_shader_id != 0)
		gl.deleteShader(geometry_shader_id);
	if (vertex_shader_id != 0)
		gl.deleteShader(vertex_shader_id);

	return result;
}